

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void * tlb_vaddr_to_host_aarch64
                 (CPUArchState_conflict1 *env,abi_ptr addr,MMUAccessType access_type,int mmu_idx)

{
  uc_struct_conflict2 *puVar1;
  TargetPageBits_conflict *pTVar2;
  ulong uVar3;
  bool bVar4;
  _Bool _Var5;
  char cVar6;
  ulong uVar7;
  ulong index;
  long lVar8;
  long lVar9;
  ulong page;
  size_t elt_ofs;
  CPUARMState_conflict *__mptr;
  
  puVar1 = env->uc;
  pTVar2 = puVar1->init_target_page;
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4f9,(char *)0x0);
  }
  lVar9 = (long)mmu_idx * 0x10;
  index = addr >> ((byte)pTVar2->bits & 0x3f) & *(ulong *)((long)env + lVar9 + -0xd0) >> 6;
  lVar8 = *(long *)((long)env + lVar9 + -200) + index * 0x40;
  uVar3 = pTVar2->mask;
  page = uVar3 & addr;
  uVar7 = *(ulong *)(lVar8 + (ulong)access_type * 8);
  if (((uVar3 | 0x200) & uVar7) == page) goto LAB_00605d15;
  elt_ofs = (ulong)access_type * 8;
  _Var5 = victim_tlb_hit(env,(long)mmu_idx,index,elt_ofs,page);
  if (_Var5) {
LAB_00605d02:
    uVar7 = *(ulong *)(lVar8 + elt_ofs);
    bVar4 = true;
  }
  else {
    cVar6 = (**(code **)(env[-1].vfp.zregs[4].d[2] + 0x48))
                      (env[-4].vfp.zregs[0x17].d + 0x14,addr,0,access_type,mmu_idx,1,0);
    if (cVar6 != '\0') {
      lVar8 = (addr >> ((byte)env->uc->init_target_page->bits & 0x3f) &
              *(ulong *)((long)env + lVar9 + -0xd0) >> 6) * 0x40 +
              *(long *)((long)env + lVar9 + -200);
      goto LAB_00605d02;
    }
    bVar4 = false;
  }
  if (!bVar4) {
    return (void *)0x0;
  }
LAB_00605d15:
  if ((uVar7 & ~puVar1->init_target_page->mask) != 0) {
    return (void *)0x0;
  }
  return (void *)(addr + *(long *)(lVar8 + 0x20));
}

Assistant:

void *tlb_vaddr_to_host(CPUArchState *env, abi_ptr addr,
                        MMUAccessType access_type, int mmu_idx)
{
    struct uc_struct *uc = env->uc;
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr, page;
    size_t elt_ofs = 0;

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        break;
    default:
        g_assert_not_reached();
    }

    page = addr & TARGET_PAGE_MASK;
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (!tlb_hit_page(uc, tlb_addr, page)) {
        uintptr_t index = tlb_index(env, mmu_idx, addr);

        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs, page)) {
            CPUState *cs = env_cpu(env);
            CPUClass *cc = CPU_GET_CLASS(cs);

            if (!cc->tlb_fill(cs, addr, 0, access_type, mmu_idx, true, 0)) {
                /* Non-faulting page table read failed.  */
                return NULL;
            }

            /* TLB resize via tlb_fill may have moved the entry.  */
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (tlb_addr & ~TARGET_PAGE_MASK) {
        /* IO access */
        return NULL;
    }

    return (void *)((uintptr_t)addr + entry->addend);
}